

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap2Local.cpp
# Opt level: O0

bool __thiscall
wasm::anon_unknown_22::Heap2Local::Heap2Local::AllocationFinder::isValidSize
          (AllocationFinder *this,Index size)

{
  Index size_local;
  AllocationFinder *this_local;
  
  return size < 0x14;
}

Assistant:

bool isValidSize(Index size) {
        // Set a reasonable limit on the size here, as valid wasm can contain
        // things like (array.new (i32.const -1)) which will likely fail at
        // runtime on a VM limitation on array size. We also are converting a
        // heap allocation to a stack allocation, which can be noticeable in
        // some cases, so to be careful here use a fairly small limit.
        return size < 20;
      }